

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Path.cpp
# Opt level: O1

StringRef llvm::sys::path::root_path(StringRef path,Style style)

{
  path pVar1;
  ulong uVar2;
  path *this;
  Style in_R8D;
  bool bVar3;
  bool bVar4;
  StringRef SVar5;
  StringRef path_00;
  const_iterator pos;
  const_iterator b;
  const_iterator local_88;
  const_iterator local_58;
  
  uVar2 = path.Length;
  this = (path *)path.Data;
  path_00.Length._0_4_ = style;
  path_00.Data = (char *)uVar2;
  path_00.Length._4_4_ = 0;
  begin(&local_58,this,path_00,in_R8D);
  local_88.Position = local_58.Position;
  local_88.S = local_58.S;
  local_88._44_4_ = local_58._44_4_;
  local_88.Component.Data = local_58.Component.Data;
  local_88.Component.Length = local_58.Component.Length;
  local_88.Path.Data = local_58.Path.Data;
  local_88.Path.Length = local_58.Path.Length;
  if (((path *)local_58.Path.Data != this) || (local_58.Position != uVar2)) {
    if ((local_58.Component.Length < 3) ||
       ((pVar1 = (path)*local_58.Component.Data, pVar1 != (path)0x2f &&
        (pVar1 != (path)0x5c || style != windows)))) {
      bVar3 = false;
    }
    else {
      bVar3 = *(path *)(local_58.Component.Data + 1) == pVar1;
    }
    if (local_58.Component.Length == 0 || style != windows) {
      bVar4 = false;
    }
    else {
      bVar4 = *(path *)(local_58.Component.Data + (local_58.Component.Length - 1)) == (path)0x3a;
    }
    if ((bool)(bVar3 | bVar4)) {
      const_iterator::operator++(&local_88);
      if (((path *)local_88.Path.Data != this) || (local_88.Position != uVar2)) {
        if (local_88.Component.Length == 0) goto LAB_00158983;
        if ((((path)*local_88.Component.Data == (path)0x2f) ||
            ((path)*local_88.Component.Data == (path)0x5c && style == windows)) &&
           (local_58.Component.Length = local_88.Component.Length + local_58.Component.Length,
           local_58.Component.Data = (char *)this, uVar2 <= local_58.Component.Length)) {
          local_58.Component.Length = uVar2;
        }
      }
      goto LAB_00158970;
    }
    if (local_58.Component.Length == 0) {
LAB_00158983:
      __assert_fail("Index < Length && \"Invalid index!\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/StringRef.h"
                    ,0xef,"char llvm::StringRef::operator[](size_t) const");
    }
    if (((path)*local_58.Component.Data == (path)0x2f) ||
       (style == windows && (path)*local_58.Component.Data == (path)0x5c)) goto LAB_00158970;
  }
  local_58.Component.Data = (char *)(path *)0x0;
  local_58.Component.Length = 0;
LAB_00158970:
  SVar5.Length = local_58.Component.Length;
  SVar5.Data = local_58.Component.Data;
  return SVar5;
}

Assistant:

StringRef root_path(StringRef path, Style style) {
  const_iterator b = begin(path, style), pos = b, e = end(path);
  if (b != e) {
    bool has_net =
        b->size() > 2 && is_separator((*b)[0], style) && (*b)[1] == (*b)[0];
    bool has_drive = (real_style(style) == Style::windows) && b->endswith(":");

    if (has_net || has_drive) {
      if ((++pos != e) && is_separator((*pos)[0], style)) {
        // {C:/,//net/}, so get the first two components.
        return path.substr(0, b->size() + pos->size());
      } else {
        // just {C:,//net}, return the first component.
        return *b;
      }
    }

    // POSIX style root directory.
    if (is_separator((*b)[0], style)) {
      return *b;
    }
  }

  return StringRef();
}